

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O1

bool __thiscall
ExecutorX86::TranslateToNative(ExecutorX86 *this,bool enableLogFiles,OutputContext *output)

{
  FastVector<unsigned_char_*,_false,_false> *pFVar1;
  byte bVar2;
  Linker *pLVar3;
  uint *puVar4;
  x86Instruction *pxVar5;
  ExternFuncInfo *pEVar6;
  FastVector<unsigned_char,_false,_false> *pFVar7;
  uchar **ppuVar8;
  ExpiredCodeBlock *pEVar9;
  ExpiredFunctionAddressList *pEVar10;
  OutputContext *output_00;
  CodeGenRegVmContext *pCVar11;
  undefined8 extraout_RAX;
  void *pvVar12;
  uchar *dst;
  uchar *puVar13;
  ulong uVar14;
  char *__function;
  int iVar15;
  ArgType AVar16;
  uint uVar17;
  uint uVar18;
  undefined7 in_register_00000031;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  FastVector<ExternFuncInfo,_false,_false> *pFVar23;
  FastVector<unsigned_int,_false,_false> *pFVar24;
  char cVar25;
  FastVector<x86Instruction,_true,_true> *this_00;
  uint uVar26;
  uint uVar27;
  RegVmCmd *pRVar28;
  uint pos;
  ExpiredFunctionAddressList info;
  TraceScope traceScope;
  ArgType local_90;
  ArgType local_8c;
  ExpiredCodeBlock local_88;
  FastVector<unsigned_int,_false,_false> *local_70;
  undefined4 local_68;
  uint local_64;
  OutputContext *local_60;
  FastVector<x86Instruction,_true,_true> *local_58;
  FastVector<unsigned_int,_false,_false> *local_50;
  RegVmCmd *local_48;
  TraceScope local_40;
  
  local_68 = (undefined4)CONCAT71(in_register_00000031,enableLogFiles);
  local_60 = output;
  if ((TranslateToNative(bool,OutputContext&)::token == '\0') &&
     (iVar15 = __cxa_guard_acquire(&TranslateToNative(bool,OutputContext&)::token), iVar15 != 0)) {
    TranslateToNative::token = NULLC::TraceGetToken("x86","TranslateToNative");
    __cxa_guard_release(&TranslateToNative(bool,OutputContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&local_40,TranslateToNative::token);
  this_00 = &this->instList;
  uVar14 = (ulong)(this->instList).count;
  if (uVar14 != 0) {
    NULLC::fillMemory(this_00->data,0,uVar14 * 0x50);
  }
  (this->instList).count = 0;
  if ((this->instList).max < 0x41) {
    FastVector<x86Instruction,_true,_true>::grow(this_00,0x40);
  }
  if (this->codeGenCtx == (CodeGenRegVmContext *)0x0) {
    pCVar11 = (CodeGenRegVmContext *)(*(code *)NULLC::alloc)(0xa30);
    CodeGenGenericContext::CodeGenGenericContext((CodeGenGenericContext *)pCVar11);
    pCVar11->x86rvm = (ExecutorX86 *)0x0;
    pCVar11->labelCount = 0;
    pCVar11->exFunctions = (ExternFuncInfo *)0x0;
    pCVar11->exTypes = (ExternTypeInfo *)0x0;
    pCVar11->exTypeExtra = (ExternMemberInfo *)0x0;
    pCVar11->exLocals = (ExternLocalInfo *)0x0;
    pCVar11->exRegVmConstants = (uint *)0x0;
    pCVar11->exRegVmConstantsEnd = (uint *)0x0;
    pCVar11->exRegVmRegKillInfo = (uchar *)0x0;
    pCVar11->exSymbols = (char *)0x0;
    pCVar11->vmState = (CodeGenRegVmStateContext *)0x0;
    pCVar11->currInstructionPos = 0;
    pCVar11->currInstructionRegKillOffset = 0;
    pCVar11->currFunctionId = 0;
    this->codeGenCtx = pCVar11;
  }
  pCVar11 = this->codeGenCtx;
  pCVar11->x86rvm = this;
  pCVar11->exFunctions = this->exFunctions->data;
  pCVar11->exTypes = this->exTypes->data;
  pLVar3 = this->exLinker;
  pCVar11->exTypeExtra = (pLVar3->exTypeExtra).data;
  pCVar11->exLocals = (pLVar3->exLocals).data;
  pFVar24 = this->exRegVmConstants;
  puVar4 = pFVar24->data;
  pCVar11->exRegVmConstants = puVar4;
  pCVar11->exRegVmConstantsEnd = puVar4 + pFVar24->count;
  pCVar11->exRegVmRegKillInfo = this->exRegVmRegKillInfo->data;
  pCVar11->exSymbols = (pLVar3->exSymbols).data;
  pCVar11->vmState = &this->vmState;
  (this->vmState).ctx = pCVar11;
  (this->vmState).exRegVmConstants = puVar4;
  pxVar5 = (this->instList).data;
  (pCVar11->ctx).x86Op = pxVar5;
  (pCVar11->ctx).x86Base = pxVar5;
  CommonSetLinker(pLVar3);
  EMIT_OP(&this->codeGenCtx->ctx,o_use32);
  pFVar24 = &this->codeJumpTargets;
  uVar18 = this->exRegVmCode->count;
  if ((this->codeJumpTargets).max <= uVar18) {
    puVar4 = pFVar24->data;
    FastVector<unsigned_int,_false,_false>::grow_no_destroy(pFVar24,uVar18);
    if (puVar4 != (uint *)0x0) {
      (*(code *)NULLC::dealloc)(puVar4);
    }
  }
  (this->codeJumpTargets).count = uVar18;
  if (uVar18 == 0) {
LAB_00146118:
    local_88.code = (uchar *)((ulong)local_88.code & 0xffffffff00000000);
    uVar18 = (this->codeJumpTargets).count;
    if (uVar18 == (this->codeJumpTargets).max) {
      FastVector<unsigned_int,_false,_false>::grow_and_add(pFVar24,uVar18,(uint *)&local_88);
    }
    else {
      (this->codeJumpTargets).count = uVar18 + 1;
      (this->codeJumpTargets).data[uVar18] = 0;
    }
    uVar18 = this->oldJumpTargetCount;
    uVar14 = (ulong)uVar18;
    pLVar3 = this->exLinker;
    uVar26 = (pLVar3->regVmJumpTargets).count;
    if (uVar26 != uVar18) {
      puVar4 = pFVar24->data;
      iVar15 = uVar26 - uVar18;
      do {
        if (((pLVar3->regVmJumpTargets).count <= (uint)uVar14) ||
           (uVar18 = (pLVar3->regVmJumpTargets).data[uVar14],
           (this->codeJumpTargets).count <= uVar18)) goto LAB_00146ffb;
        puVar4[uVar18] = 1;
        uVar14 = uVar14 + 1;
        iVar15 = iVar15 + -1;
      } while (iVar15 != 0);
    }
    uVar14 = (ulong)(pLVar3->exFunctions).count;
    if (uVar14 != 0) {
      puVar4 = pFVar24->data;
      uVar18 = 2;
      lVar20 = 8;
      uVar22 = 0;
      do {
        if ((pLVar3->exFunctions).count <= uVar22) goto LAB_0014701a;
        pEVar6 = (pLVar3->exFunctions).data;
        uVar26 = *(uint *)((long)pEVar6 + lVar20 + -4);
        uVar19 = (ulong)uVar26;
        if ((uVar19 != 0xffffffff) && (*(int *)((long)&pEVar6->offsetToName + lVar20) != 0)) {
          if ((this->codeJumpTargets).count <= uVar26) goto LAB_00146ffb;
          uVar26 = puVar4[uVar19];
          if (uVar26 < 0x100) {
            puVar4[uVar19] = uVar26 | uVar18;
          }
        }
        uVar22 = uVar22 + 1;
        uVar18 = uVar18 + 0x100;
        lVar20 = lVar20 + 0x94;
      } while (uVar14 != uVar22);
    }
    uVar18 = this->exRegVmCode->count;
    if ((this->codeRegKillInfoOffsets).max <= uVar18) {
      puVar4 = (this->codeRegKillInfoOffsets).data;
      FastVector<unsigned_int,_false,_false>::grow_no_destroy(&this->codeRegKillInfoOffsets,uVar18);
      if (puVar4 != (uint *)0x0) {
        (*(code *)NULLC::dealloc)(puVar4);
      }
    }
    (this->codeRegKillInfoOffsets).count = uVar18;
    uVar14 = (ulong)this->lastInstructionCount;
    uVar18 = this->exRegVmCode->count;
    if (this->lastInstructionCount != uVar18) {
      pFVar7 = this->exRegVmRegKillInfo;
      puVar4 = (this->codeRegKillInfoOffsets).data;
      do {
        if ((this->codeRegKillInfoOffsets).count <= uVar14) goto LAB_00146ffb;
        puVar4[uVar14] = this->oldRegKillInfoCount;
        uVar26 = this->oldRegKillInfoCount;
        if (pFVar7->count <= uVar26) {
          __function = 
          "T &FastVector<unsigned char>::operator[](unsigned int) [T = unsigned char, zeroNewMemory = false, skipConstructor = false]"
          ;
          goto LAB_00147010;
        }
        bVar2 = pFVar7->data[uVar26];
        this->oldRegKillInfoCount = (bVar2 & 0xf) + (bVar2 >> 4) + uVar26 + 1;
        uVar14 = uVar14 + 1;
      } while (uVar18 != uVar14);
    }
    if (this->oldRegKillInfoCount != this->exRegVmRegKillInfo->count) {
      __assert_fail("oldRegKillInfoCount == exRegVmRegKillInfo.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                    ,0x53c,"bool ExecutorX86::TranslateToNative(bool, OutputContext &)");
    }
    local_58 = this_00;
    if ((this->codeRunning == true) && ((this->functionAddress).max <= this->exFunctions->count)) {
      local_88.code = (uchar *)(this->functionAddress).data;
      local_88.codeSize = (this->functionAddress).count;
      uVar18 = (this->expiredFunctionAddressLists).count;
      if (uVar18 == (this->expiredFunctionAddressLists).max) {
        FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false>::grow_and_add
                  (&this->expiredFunctionAddressLists,uVar18,(ExpiredFunctionAddressList *)&local_88
                  );
      }
      else {
        (this->expiredFunctionAddressLists).count = uVar18 + 1;
        pEVar10 = (this->expiredFunctionAddressLists).data + uVar18;
        pEVar10->data = (uchar **)local_88.code;
        *(ulong *)&pEVar10->count = CONCAT44(local_88._12_4_,local_88.codeSize);
      }
      pFVar1 = &this->functionAddress;
      pFVar1->data = (uchar **)0x0;
      (this->functionAddress).max = 0;
      (this->functionAddress).count = 0;
      uVar18 = this->exFunctions->count;
      FastVector<unsigned_char_*,_false,_false>::grow_no_destroy(pFVar1,uVar18);
      (this->functionAddress).count = uVar18;
      uVar26 = this->oldFunctionSize;
      this_00 = local_58;
      if ((ulong)uVar26 != 0) {
        uVar17 = (this->instAddress).count;
        lVar20 = 4;
        uVar14 = 0;
        do {
          if (this->exFunctions->count <= uVar14) goto LAB_0014701a;
          uVar27 = *(uint *)((long)&this->exFunctions->data->offsetToName + lVar20);
          if ((ulong)uVar27 == 0xffffffff) {
            if (uVar18 <= uVar14) goto LAB_00147031;
            puVar13 = (uchar *)0x0;
          }
          else {
            if ((uVar17 <= uVar27) || (uVar18 <= uVar14)) goto LAB_00147031;
            puVar13 = (this->instAddress).data[uVar27];
          }
          pFVar1->data[uVar14] = puVar13;
          uVar14 = uVar14 + 1;
          lVar20 = lVar20 + 0x94;
        } while (uVar26 != uVar14);
      }
    }
    else {
      uVar18 = this->exFunctions->count;
      if ((this->functionAddress).max <= uVar18) {
        ppuVar8 = (this->functionAddress).data;
        FastVector<unsigned_char_*,_false,_false>::grow_no_destroy(&this->functionAddress,uVar18);
        if (ppuVar8 != (uchar **)0x0) {
          (*(code *)NULLC::dealloc)(ppuVar8);
        }
      }
      (this->functionAddress).count = uVar18;
    }
    (this->vmState).functionAddress = (this->functionAddress).data;
    AVar16 = argNone;
    SetOptimizationLookBehind(&this->codeGenCtx->ctx,false);
    local_90 = this->lastInstructionCount;
    local_70 = &this->globalCodeRanges;
    local_50 = pFVar24;
    while( true ) {
      if (this->exRegVmCode->count <= local_90) break;
      pRVar28 = this->exRegVmCode->data + local_90;
      uVar14 = ((long)(this->codeGenCtx->ctx).x86Op - (long)(this->instList).data >> 4) *
               -0x3333333333333333;
      uVar18 = (uint)uVar14;
      (this->instList).count = uVar18;
      uVar18 = uVar18 + 0x40;
      if ((this->instList).max <= uVar18) {
        FastVector<x86Instruction,_true,_true>::grow(this_00,uVar18);
      }
      pCVar11 = this->codeGenCtx;
      pxVar5 = (this->instList).data;
      uVar14 = uVar14 & 0xffffffff;
      (pCVar11->ctx).x86Op = pxVar5 + uVar14;
      (pCVar11->ctx).x86Base = pxVar5;
      pxVar5[uVar14].instID = local_90 + argNumber;
      if ((this->codeJumpTargets).count <= local_90) goto LAB_00146ffb;
      if (pFVar24->data[local_90] != 0) {
        SetOptimizationLookBehind(&pCVar11->ctx,false);
      }
      pCVar11 = this->codeGenCtx;
      pCVar11->currInstructionPos = local_90;
      if (((this->codeRegKillInfoOffsets).count <= local_90) ||
         (pCVar11->currInstructionRegKillOffset = (this->codeRegKillInfoOffsets).data[local_90],
         local_48 = pRVar28, (this->codeJumpTargets).count <= local_90)) goto LAB_00146ffb;
      if ((pFVar24->data[local_90] & 6) != 0) {
        if ((pFVar24->data[local_90] & 4) != 0) {
          pCVar11->currFunctionId = 0;
          AVar16 = local_90;
        }
        EMIT_OP_NUM(&pCVar11->ctx,o_set_tracking,0);
        EMIT_OP_REG(&this->codeGenCtx->ctx,o_push,rEBX);
        EMIT_OP_REG(&this->codeGenCtx->ctx,o_push,rR15);
        EMIT_OP_REG_NUM(&this->codeGenCtx->ctx,o_sub64,rESP,0x28);
        EMIT_OP_NUM(&this->codeGenCtx->ctx,o_set_tracking,1);
        if ((this->codeJumpTargets).count <= local_90) goto LAB_00146ffb;
        if ((pFVar24->data[local_90] & 2) != 0) {
          uVar18 = pFVar24->data[local_90] >> 8;
          pCVar11 = this->codeGenCtx;
          pCVar11->currFunctionId = uVar18;
          local_8c = AVar16;
          if ((this->exLinker->exFunctions).count <= uVar18) goto LAB_0014701a;
          pEVar6 = (this->exLinker->exFunctions).data;
          uVar26 = pEVar6[uVar18].argumentSize;
          uVar17 = pEVar6[uVar18].stackSize;
          EMIT_OP_NUM(&pCVar11->ctx,o_set_tracking,0);
          EMIT_OP_REG_RPTR(&this->codeGenCtx->ctx,o_mov64,rEBX,sQWORD,rR13,0x140);
          EMIT_OP_REG_RPTR(&this->codeGenCtx->ctx,o_mov64,rR15,sQWORD,rR13,0x108);
          EMIT_OP_REG_RPTR(&this->codeGenCtx->ctx,o_mov64,rEAX,sQWORD,rR13,0x100);
          EMIT_OP_RPTR_REG(&this->codeGenCtx->ctx,o_mov64,sQWORD,rEBX,0,rEAX);
          uVar17 = uVar17 + 0xf & 0xfffffff0;
          EMIT_OP_RPTR_NUM(&this->codeGenCtx->ctx,o_add64,sQWORD,rR13,0x108,uVar17);
          EMIT_OP_RPTR_NUM(&this->codeGenCtx->ctx,o_add64,sQWORD,rR13,0x140,
                           pEVar6[uVar18].regVmRegisters << 3);
          EMIT_OP_NUM(&this->codeGenCtx->ctx,o_set_tracking,1);
          if (pEVar6[uVar18].regVmRegisters < 5) {
            uVar14 = 0;
          }
          else {
            uVar27 = pEVar6[uVar18].regVmRegisters - 4;
            uVar14 = CONCAT71((int7)((ulong)extraout_RAX >> 8),uVar27 >= 9);
            if (uVar27 < 9) {
              if (4 < pEVar6[uVar18].regVmRegisters) {
                local_64 = (uint)uVar14;
                iVar15 = 4;
                uVar27 = 0x20;
                do {
                  EMIT_OP_RPTR_NUM(&this->codeGenCtx->ctx,o_mov64,sQWORD,rEBX,uVar27,0);
                  iVar15 = iVar15 + 1;
                  uVar27 = uVar27 + 8;
                } while (iVar15 < pEVar6[uVar18].regVmRegisters);
                uVar14 = (ulong)local_64;
                this_00 = local_58;
              }
            }
            else {
              EMIT_OP_REG_REG(&this->codeGenCtx->ctx,o_xor,rEAX,rEAX);
              EMIT_OP_REG_RPTR(&this->codeGenCtx->ctx,o_lea,rEDI,sQWORD,rEBX,0x20);
              EMIT_OP_REG_NUM(&this->codeGenCtx->ctx,o_mov,rECX,uVar27);
              EMIT_OP(&this->codeGenCtx->ctx,o_rep_stosq);
              uVar14 = 1;
            }
          }
          pFVar24 = local_50;
          AVar16 = local_8c;
          uVar18 = uVar17 - uVar26;
          if (uVar18 != 0) {
            if ((uVar18 & 3) != 0) {
              __assert_fail("count % 4 == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                            ,0x5c3,"bool ExecutorX86::TranslateToNative(bool, OutputContext &)");
            }
            if (uVar18 < 0x11) {
              if (uVar17 != uVar26) {
                iVar15 = -(uint)(uVar18 >> 2 == 0) - (uVar18 >> 2);
                do {
                  EMIT_OP_RPTR_NUM(&this->codeGenCtx->ctx,o_mov,sDWORD,rR15,uVar26,0);
                  uVar26 = uVar26 + 4;
                  iVar15 = iVar15 + 1;
                  AVar16 = local_8c;
                } while (iVar15 != 0);
              }
            }
            else {
              if ((char)uVar14 == '\0') {
                EMIT_OP_REG_REG(&this->codeGenCtx->ctx,o_xor,rEAX,rEAX);
              }
              EMIT_OP_REG_RPTR(&this->codeGenCtx->ctx,o_lea,rEDI,sQWORD,rR15,uVar26);
              EMIT_OP_REG_NUM(&this->codeGenCtx->ctx,o_mov,rECX,uVar18 >> 2);
              EMIT_OP(&this->codeGenCtx->ctx,o_rep_stosd);
            }
          }
        }
      }
      pRVar28 = local_48;
      if ((local_48->code == '\x1d') && (local_48->rA != '\0')) {
        if ((this->codeJumpTargets).count <= local_48->argument) goto LAB_00146ffb;
        pFVar24->data[local_48->argument] = pFVar24->data[local_48->argument] | 4;
        if (AVar16 != argNone) {
          uVar18 = (this->globalCodeRanges).count;
          if (uVar18 == (this->globalCodeRanges).max) {
            FastVector<unsigned_int,_false,_false>::grow_and_add(local_70,uVar18,&local_90);
          }
          else {
            (this->globalCodeRanges).count = uVar18 + 1;
            (this->globalCodeRanges).data[uVar18] = local_90;
          }
        }
        uVar18 = (this->globalCodeRanges).count;
        if (uVar18 == (this->globalCodeRanges).max) {
          FastVector<unsigned_int,_false,_false>::grow_and_add(local_70,uVar18,&pRVar28->argument);
        }
        else {
          uVar26 = pRVar28->argument;
          (this->globalCodeRanges).count = uVar18 + 1;
          (this->globalCodeRanges).data[uVar18] = uVar26;
        }
        if (local_90 != argNone) {
          EMIT_OP_REG_NUM(&this->codeGenCtx->ctx,o_add64,rESP,0x28);
          EMIT_OP_REG(&this->codeGenCtx->ctx,o_pop,rR15);
          EMIT_OP_REG(&this->codeGenCtx->ctx,o_pop,rEBX);
        }
      }
      local_90 = local_90 + argNumber;
      (**(code **)(NULLC::cgFuncs + (ulong)pRVar28->code * 8))(this->codeGenCtx,*pRVar28);
      CodeGenGenericContext::KillLateUnreadRegVmRegisters
                (&this->codeGenCtx->ctx,
                 this->exRegVmRegKillInfo->data + this->codeGenCtx->currInstructionRegKillOffset);
      CodeGenGenericContext::UnlockRegisters(&this->codeGenCtx->ctx);
      SetOptimizationLookBehind(&this->codeGenCtx->ctx,true);
    }
    uVar18 = (this->globalCodeRanges).count;
    if (uVar18 == (this->globalCodeRanges).max) {
      FastVector<unsigned_int,_false,_false>::grow_and_add(local_70,uVar18,&local_90);
    }
    else {
      (this->globalCodeRanges).count = uVar18 + 1;
      (this->globalCodeRanges).data[uVar18] = local_90;
    }
    output_00 = local_60;
    pCVar11 = this->codeGenCtx;
    ((pCVar11->ctx).x86Op)->instID = local_90 + argNumber;
    uVar18 = this->exRegVmCode->count;
    if (uVar18 < (this->codeJumpTargets).count) {
      if ((pFVar24->data[uVar18] & 6) != 0) {
        EMIT_OP_NUM(&pCVar11->ctx,o_set_tracking,0);
        EMIT_OP_REG(&this->codeGenCtx->ctx,o_push,rEBX);
        EMIT_OP_REG(&this->codeGenCtx->ctx,o_push,rR15);
        EMIT_OP_REG_NUM(&this->codeGenCtx->ctx,o_sub64,rESP,0x28);
        EMIT_OP_NUM(&this->codeGenCtx->ctx,o_set_tracking,1);
      }
      EMIT_OP_REG_REG(&this->codeGenCtx->ctx,o_xor,rEAX,rEAX);
      EMIT_OP_REG_NUM(&this->codeGenCtx->ctx,o_add64,rESP,0x28);
      EMIT_OP_REG(&this->codeGenCtx->ctx,o_pop,rR15);
      EMIT_OP_REG(&this->codeGenCtx->ctx,o_pop,rEBX);
      EMIT_OP(&this->codeGenCtx->ctx,o_ret);
      uVar18 = (this->codeJumpTargets).count;
      if (uVar18 != 0) {
        (this->codeJumpTargets).count = uVar18 - 1;
        if ((this->instList).count == 0) {
          __function = 
          "T &FastVector<x86Instruction, true, true>::operator[](unsigned int) [T = x86Instruction, zeroNewMemory = true, skipConstructor = true]"
          ;
          goto LAB_00147010;
        }
        uVar18 = (int)((ulong)((long)(this->codeGenCtx->ctx).x86Op - (long)(this->instList).data) >>
                      4) * -0x33333333;
        if ((this->instList).max <= uVar18) {
          FastVector<x86Instruction,_true,_true>::grow(this_00,uVar18);
        }
        (this->instList).count = uVar18;
        local_88.code = (uchar *)((ulong)local_88.code & 0xffffffff00000000);
        uVar18 = (this->codeJumpTargets).count;
        if (uVar18 == (this->codeJumpTargets).max) {
          FastVector<unsigned_int,_false,_false>::grow_and_add(pFVar24,uVar18,(uint *)&local_88);
        }
        else {
          (this->codeJumpTargets).count = uVar18 + 1;
          (this->codeJumpTargets).data[uVar18] = 0;
        }
        if ((char)local_68 != '\0') {
          if (output_00->stream != (void *)0x0) {
            __assert_fail("!output.stream",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                          ,0x669,"bool ExecutorX86::TranslateToNative(bool, OutputContext &)");
          }
          pvVar12 = (*output_00->openStream)("asmX86.txt");
          output_00->stream = pvVar12;
          if (pvVar12 != (void *)0x0) {
            SaveListing(this,output_00);
            (*output_00->closeStream)(output_00->stream);
            output_00->stream = (void *)0x0;
          }
        }
        uVar18 = (this->codeJumpTargets).count;
        if (uVar18 != 0) {
          (this->codeJumpTargets).count = uVar18 - 1;
          uVar26 = (this->instList).count * 8 + this->binCodeSize;
          uVar18 = this->binCodeReserved;
          if (uVar18 < uVar26) {
            this->binCodeReserved = uVar26 + 0x1000;
            dst = (uchar *)(*(code *)NULLC::alloc)();
            puVar13 = this->binCode;
            if ((puVar13 != (uchar *)0x0) && (this->codeRunning == false)) {
              pvVar12 = (void *)(((ulong)(puVar13 + 0xfff) & 0xfffffffffffff000) - 0x1000);
              mprotect(pvVar12,((ulong)(puVar13 + (ulong)uVar18 + 0xfff) & 0xfffffffffffff000) -
                               (long)pvVar12,3);
            }
            pvVar12 = (void *)(((ulong)(dst + 0xfff) & 0xfffffffffffff000) - 0x1000);
            mprotect(pvVar12,((ulong)(dst + (ulong)this->binCodeReserved + 0xfff) &
                             0xfffffffffffff000) - (long)pvVar12,7);
            if ((ulong)this->binCodeSize != 0) {
              NULLC::copyMemory(dst,this->binCode,(ulong)this->binCodeSize);
            }
            cVar25 = this->codeRunning;
            if ((bool)cVar25 == true) {
              local_88.code = this->binCode;
              local_88.unwindTable = (this->functionWin64UnwindTable).data;
              (this->functionWin64UnwindTable).data = (_RUNTIME_FUNCTION *)0x0;
              (this->functionWin64UnwindTable).max = 0;
              (this->functionWin64UnwindTable).count = 0;
              uVar26 = (this->expiredCodeBlocks).count;
              local_88.codeSize = uVar18;
              if (uVar26 == (this->expiredCodeBlocks).max) {
                FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false>::grow_and_add
                          (&this->expiredCodeBlocks,uVar26,&local_88);
              }
              else {
                pEVar9 = (this->expiredCodeBlocks).data;
                (this->expiredCodeBlocks).count = uVar26 + 1;
                pEVar9[uVar26].unwindTable = local_88.unwindTable;
                pEVar9 = pEVar9 + uVar26;
                pEVar9->code = local_88.code;
                *(ulong *)&pEVar9->codeSize = CONCAT44(local_88._12_4_,uVar18);
              }
            }
            else {
              (*(code *)NULLC::dealloc)(this->binCode);
            }
            uVar14 = (ulong)(this->instAddress).count;
            if (uVar14 != 0) {
              uVar22 = 0;
              do {
                ppuVar8 = (this->instAddress).data;
                ppuVar8[uVar22] = dst + ((long)ppuVar8[uVar22] - (long)this->binCode);
                uVar22 = uVar22 + 1;
              } while (uVar14 != uVar22);
            }
            uVar14 = (ulong)(this->functionAddress).count;
            if (uVar14 != 0) {
              uVar22 = 0;
              do {
                ppuVar8 = (this->functionAddress).data;
                puVar13 = ppuVar8[uVar22];
                if (puVar13 != (uchar *)0x0) {
                  ppuVar8[uVar22] = dst + ((long)puVar13 - (long)this->binCode);
                }
                uVar22 = uVar22 + 1;
              } while (uVar14 != uVar22);
            }
            uVar14 = (ulong)(this->expiredFunctionAddressLists).count;
            if (uVar14 != 0) {
              uVar22 = 0;
              do {
                pEVar10 = (this->expiredFunctionAddressLists).data;
                uVar19 = (ulong)pEVar10[uVar22].count;
                if (uVar19 != 0) {
                  uVar21 = 0;
                  do {
                    ppuVar8 = pEVar10[uVar22].data;
                    puVar13 = ppuVar8[uVar21];
                    if (puVar13 != (uchar *)0x0) {
                      ppuVar8[uVar21] = dst + ((long)puVar13 - (long)this->binCode);
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar19 != uVar21);
                }
                uVar22 = uVar22 + 1;
              } while (uVar22 != uVar14);
            }
            this->binCode = dst;
          }
          else {
            cVar25 = '\0';
          }
          puVar13 = this->binCode + ((ulong)this->binCodeSize - 10);
          if ((ulong)this->binCodeSize == 0) {
            puVar13 = this->binCode;
          }
          pFVar1 = &this->instAddress;
          uVar18 = this->exRegVmCode->count + 1;
          if ((this->instAddress).max <= uVar18) {
            ppuVar8 = pFVar1->data;
            FastVector<unsigned_char_*,_false,_false>::grow_no_destroy(pFVar1,uVar18);
            if (ppuVar8 != (uchar **)0x0) {
              (*(code *)NULLC::dealloc)(ppuVar8);
            }
          }
          (this->instAddress).count = uVar18;
          NULLC::fillMemory((this->instAddress).data + this->lastInstructionCount,0,
                            (ulong)((this->exRegVmCode->count - this->lastInstructionCount) + 1) <<
                            3);
          (this->vmState).instAddress = (this->instAddress).data;
          x86ClearLabels();
          x86ReserveLabels(this->codeGenCtx->labelCount);
          puVar13 = x86TranslateInstructionList
                              (puVar13,this->binCode + this->binCodeReserved,(this->instList).data,
                               (this->instList).count,(this->instAddress).data);
          if (this->binCodeReserved <= this->binCodeSize) {
            __assert_fail("binCodeSize < binCodeReserved",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                          ,0x756,"bool ExecutorX86::TranslateToNative(bool, OutputContext &)");
          }
          uVar18 = (int)puVar13 - *(int *)&this->binCode;
          this->binCodeSize = uVar18;
          if (this->binCodeReserved <= uVar18) {
            __assert_fail("unsigned(code - binCode) < binCodeReserved",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                          ,0x7af,"bool ExecutorX86::TranslateToNative(bool, OutputContext &)");
          }
          x86SatisfyJumps(pFVar1);
          uVar18 = 0;
          if (cVar25 == '\0') {
            uVar18 = this->oldFunctionSize;
          }
          pFVar23 = this->exFunctions;
          uVar26 = pFVar23->count;
          if (uVar18 < uVar26) {
            uVar17 = (this->instAddress).count;
            uVar14 = (ulong)(this->functionAddress).count;
            uVar22 = (ulong)uVar18;
            lVar20 = uVar22 * 0x94 + 4;
            do {
              uVar18 = *(uint *)((long)&pFVar23->data->offsetToName + lVar20);
              if ((ulong)uVar18 == 0xffffffff) {
                if (uVar14 <= uVar22) goto LAB_00147031;
                puVar13 = (uchar *)0x0;
              }
              else {
                if ((uVar17 <= uVar18) || (uVar14 <= uVar22)) goto LAB_00147031;
                puVar13 = pFVar1->data[uVar18];
              }
              (this->functionAddress).data[uVar22] = puVar13;
              uVar22 = uVar22 + 1;
              pFVar23 = this->exFunctions;
              uVar26 = pFVar23->count;
              lVar20 = lVar20 + 0x94;
            } while (uVar22 < uVar26);
          }
          this->lastInstructionCount = this->exRegVmCode->count;
          this->oldJumpTargetCount = (this->exLinker->regVmJumpTargets).count;
          this->oldRegKillInfoCount = this->exRegVmRegKillInfo->count;
          this->oldFunctionSize = uVar26;
          NULLC::TraceScope::~TraceScope(&local_40);
          return true;
        }
      }
      __assert_fail("count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x73,
                    "void FastVector<unsigned int>::pop_back() [T = unsigned int, zeroNewMemory = false, skipConstructor = false]"
                   );
    }
  }
  else {
    uVar26 = this->lastInstructionCount;
    if (uVar26 < uVar18) {
      NULLC::fillMemory(pFVar24->data + uVar26,0,(ulong)(uVar18 - uVar26) << 2);
      goto LAB_00146118;
    }
  }
LAB_00146ffb:
  __function = 
  "T &FastVector<unsigned int>::operator[](unsigned int) [T = unsigned int, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_00147010:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,__function);
LAB_00147031:
  __function = 
  "T &FastVector<unsigned char *>::operator[](unsigned int) [T = unsigned char *, zeroNewMemory = false, skipConstructor = false]"
  ;
  goto LAB_00147010;
LAB_0014701a:
  __function = 
  "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
  ;
  goto LAB_00147010;
}

Assistant:

bool ExecutorX86::TranslateToNative(bool enableLogFiles, OutputContext &output)
{
	TRACE_SCOPE("x86", "TranslateToNative");

	if(instList.size())
		NULLC::fillMemory(instList.data, 0, sizeof(x86Instruction) * instList.size());
	instList.clear();
	instList.reserve(64);

	if(!codeGenCtx)
		codeGenCtx = NULLC::construct<CodeGenRegVmContext>();

	codeGenCtx->x86rvm = this;

	codeGenCtx->exFunctions = exFunctions.data;
	codeGenCtx->exTypes = exTypes.data;
	codeGenCtx->exTypeExtra = exLinker->exTypeExtra.data;
	codeGenCtx->exLocals = exLinker->exLocals.data;
	codeGenCtx->exRegVmConstants = exRegVmConstants.data;
	codeGenCtx->exRegVmConstantsEnd = exRegVmConstants.data + exRegVmConstants.count;
	codeGenCtx->exRegVmRegKillInfo = exRegVmRegKillInfo.data;
	codeGenCtx->exSymbols = exLinker->exSymbols.data;

	codeGenCtx->vmState = &vmState;

	vmState.ctx = codeGenCtx;
	vmState.exRegVmConstants = exRegVmConstants.data;

	codeGenCtx->ctx.SetLastInstruction(instList.data, instList.data);

	CommonSetLinker(exLinker);

	EMIT_OP(codeGenCtx->ctx, o_use32);

	codeJumpTargets.resize(exRegVmCode.size());
	if(codeJumpTargets.size())
		NULLC::fillMemory(&codeJumpTargets[lastInstructionCount], 0, (codeJumpTargets.size() - lastInstructionCount) * sizeof(codeJumpTargets[0]));

	// Mirror extra global return so that jump to global return can be marked (rviNop, because we will have some custom code)
	codeJumpTargets.push_back(0);
	for(unsigned i = oldJumpTargetCount, e = exLinker->regVmJumpTargets.size(); i != e; i++)
		codeJumpTargets[exLinker->regVmJumpTargets[i]] = 1;

	// Mark function locations
	for(unsigned i = 0, e = exLinker->exFunctions.size(); i != e; i++)
	{
		ExternFuncInfo &target = exLinker->exFunctions[i];

		if(target.regVmAddress != -1 && target.regVmCodeSize != 0 && (codeJumpTargets[target.regVmAddress] >> 8) == 0)
			codeJumpTargets[target.regVmAddress] |= 2 + (i << 8);
	}

	// Find instruction register kill info positions
	codeRegKillInfoOffsets.resize(exRegVmCode.size());
	for(unsigned i = lastInstructionCount, e = exRegVmCode.size(); i != e; i++)
	{
		codeRegKillInfoOffsets[i] = oldRegKillInfoCount;

		unsigned counts = exRegVmRegKillInfo[oldRegKillInfoCount];

		oldRegKillInfoCount += 1 + (counts >> 4) + (counts & 0xf);
	}
	assert(oldRegKillInfoCount == exRegVmRegKillInfo.size());

	if(codeRunning && exFunctions.size() >= functionAddress.max)
	{
		ExpiredFunctionAddressList info;

		info.data = functionAddress.data;
		info.count = functionAddress.count;

		expiredFunctionAddressLists.push_back(info);

		functionAddress.data = NULL;
		functionAddress.count = 0;
		functionAddress.max = 0;

		functionAddress.resize(exFunctions.size());

		for(unsigned int i = 0; i < oldFunctionSize; i++)
		{
			if(exFunctions[i].regVmAddress != -1)
				functionAddress[i] = instAddress[exFunctions[i].regVmAddress];
			else
				functionAddress[i] = 0;
		}
	}
	else
	{
		functionAddress.resize(exFunctions.size());
	}

	vmState.functionAddress = functionAddress.data;

	SetOptimizationLookBehind(codeGenCtx->ctx, false);

	unsigned activeGlobalCodeStart = 0;

	unsigned int pos = lastInstructionCount;
	while(pos < exRegVmCode.size())
	{
		RegVmCmd &cmd = exRegVmCode[pos];

		unsigned int currSize = (int)(codeGenCtx->ctx.GetLastInstruction() - instList.data);
		instList.count = currSize;
		if(currSize + 64 >= instList.max)
			instList.grow(currSize + 64);

		codeGenCtx->ctx.SetLastInstruction(instList.data + currSize, instList.data);

		codeGenCtx->ctx.GetLastInstruction()->instID = pos + 1;

		if(codeJumpTargets[pos])
			SetOptimizationLookBehind(codeGenCtx->ctx, false);

		codeGenCtx->currInstructionPos = pos;
		codeGenCtx->currInstructionRegKillOffset = codeRegKillInfoOffsets[pos];

		// Frame setup
		if((codeJumpTargets[pos] & 6) != 0)
		{
			if(codeJumpTargets[pos] & 4)
			{
				activeGlobalCodeStart = pos;

				codeGenCtx->currFunctionId = 0;
			}

			EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 0);

#if defined(_M_X64)
			EMIT_OP_REG(codeGenCtx->ctx, o_push, rRBX);
			EMIT_OP_REG(codeGenCtx->ctx, o_push, rR15);
			EMIT_OP_REG_NUM(codeGenCtx->ctx, o_sub64, rRSP, 40);
#else
			EMIT_OP_REG(codeGenCtx->ctx, o_push, rEBP);
			EMIT_OP_REG_REG(codeGenCtx->ctx, o_mov, rEBP, rESP);
			EMIT_OP_REG(codeGenCtx->ctx, o_push, rEBX);
			EMIT_OP_REG(codeGenCtx->ctx, o_push, rESI);
#endif

			EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 1);

			// Generate function prologue (register cleanup, data stack advance, data stack cleanup)
			if(codeJumpTargets[pos] & 2)
			{
				codeGenCtx->currFunctionId = codeJumpTargets[pos] >> 8;

				ExternFuncInfo &target = exLinker->exFunctions[codeGenCtx->currFunctionId];

				unsigned stackSize = (target.stackSize + 0xf) & ~0xf;
				unsigned argumentsSize = target.argumentSize;

#if defined(_M_X64)
				EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 0);

				EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_mov64, rRBX, sQWORD, rR13, nullcOffsetOf(&vmState, regFileLastTop));
				EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_mov64, rR15, sQWORD, rR13, nullcOffsetOf(&vmState, dataStackTop));

				EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_mov64, rRAX, sQWORD, rR13, nullcOffsetOf(&vmState, dataStackBase));
				EMIT_OP_RPTR_REG(codeGenCtx->ctx, o_mov64, sQWORD, rRBX, 0, rRAX);

				// Advance frame top
				EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_add64, sQWORD, rR13, nullcOffsetOf(&vmState, dataStackTop), stackSize); // vmState->dataStackTop += stackSize;

				// Advance register top
				EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_add64, sQWORD, rR13, nullcOffsetOf(&vmState, regFileLastTop), target.regVmRegisters * 8); // vmState->regFileLastTop += target.regVmRegisters;

				EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 1);

				bool isRaxCleared = false;

				// Clear register values
				if (target.regVmRegisters > rvrrCount)
				{
					unsigned count = target.regVmRegisters - rvrrCount;

					if(count <= 8)
					{
						for(int regId = rvrrCount; regId < target.regVmRegisters; regId++)
							EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_mov64, sQWORD, rRBX, regId * 8, 0);
					}
					else
					{
						isRaxCleared = true;

						EMIT_OP_REG_REG(codeGenCtx->ctx, o_xor, rRAX, rRAX);
						EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_lea, rRDI, sQWORD, rRBX, rvrrCount * 8);
						EMIT_OP_REG_NUM(codeGenCtx->ctx, o_mov, rECX, count);
						EMIT_OP(codeGenCtx->ctx, o_rep_stosq);
					}
				}

				// Clear data stack
				// TODO: use target.stackSize which is smaller?
				if(unsigned count = stackSize - argumentsSize)
				{
					assert(count % 4 == 0);

					if(count <= 16)
					{
						for(unsigned dataId = 0; dataId < count / 4; dataId++)
							EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_mov, sDWORD, rR15, argumentsSize + dataId * 4, 0);
					}
					else
					{
						if(!isRaxCleared)
							EMIT_OP_REG_REG(codeGenCtx->ctx, o_xor, rRAX, rRAX);

						EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_lea, rRDI, sQWORD, rR15, argumentsSize);
						EMIT_OP_REG_NUM(codeGenCtx->ctx, o_mov, rECX, count / 4);
						EMIT_OP(codeGenCtx->ctx, o_rep_stosd);
					}
				}
#else
				EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 0);

				EMIT_OP_REG_ADDR(codeGenCtx->ctx, o_mov, rEBX, sDWORD, uintptr_t(&vmState.regFileLastTop));
				EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_mov, rESI, sDWORD, rNONE, 1, rEBX, rvrrFrame * 8);

				// Advance frame top
				EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_add, sDWORD, uintptr_t(&vmState.dataStackTop), stackSize); // vmState->dataStackTop += stackSize;

				// Advance register top
				EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_add, sDWORD, uintptr_t(&vmState.regFileLastTop), target.regVmRegisters * 8); // vmState->regFileLastTop += target.regVmRegisters;

				EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 1);

				bool isEaxCleared = false;

				// Clear register values
				if(target.regVmRegisters > rvrrCount)
				{
					unsigned count = target.regVmRegisters - rvrrCount;

					if(count <= 4)
					{
						for(int regId = rvrrCount; regId < target.regVmRegisters; regId++)
						{
							EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_mov, sDWORD, rEBX, regId * 8, 0);
							EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_mov, sDWORD, rEBX, regId * 8, 4);
						}
					}
					else
					{
						isEaxCleared = true;

						EMIT_OP_REG_REG(codeGenCtx->ctx, o_xor, rEAX, rEAX);
						EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_lea, rEDI, sDWORD, rEBX, rvrrCount * 8);
						EMIT_OP_REG_NUM(codeGenCtx->ctx, o_mov, rECX, count * 2);
						EMIT_OP(codeGenCtx->ctx, o_rep_stosd);
					}
				}

				// Clear data stack
				// TODO: use target.stackSize which is smaller?
				if(unsigned count = stackSize - argumentsSize)
				{
					assert(count % 4 == 0);

					if(count <= 16)
					{
						for(unsigned dataId = 0; dataId < count / 4; dataId++)
							EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_mov, sDWORD, rESI, argumentsSize + dataId * 4, 0);
					}
					else
					{
						if(!isEaxCleared)
							EMIT_OP_REG_REG(codeGenCtx->ctx, o_xor, rEAX, rEAX);

						EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_lea, rEDI, sDWORD, rESI, argumentsSize);
						EMIT_OP_REG_NUM(codeGenCtx->ctx, o_mov, rECX, count / 4);
						EMIT_OP(codeGenCtx->ctx, o_rep_stosd);
					}
				}
#endif
			}
		}

		if(cmd.code == rviJmp && cmd.rA)
		{
			codeJumpTargets[cmd.argument] |= 4;

			if(activeGlobalCodeStart != 0)
				globalCodeRanges.push_back(pos);

			globalCodeRanges.push_back(cmd.argument);

			if(pos)
			{
#if defined(_M_X64)
				EMIT_OP_REG_NUM(codeGenCtx->ctx, o_add64, rRSP, 40);
				EMIT_OP_REG(codeGenCtx->ctx, o_pop, rR15);
				EMIT_OP_REG(codeGenCtx->ctx, o_pop, rRBX);
#else
				EMIT_OP_REG(codeGenCtx->ctx, o_pop, rESI);
				EMIT_OP_REG(codeGenCtx->ctx, o_pop, rEBX);
				EMIT_OP_REG_REG(codeGenCtx->ctx, o_mov, rESP, rEBP);
				EMIT_REG_READ(codeGenCtx->ctx, rESP);
				EMIT_OP_REG(codeGenCtx->ctx, o_pop, rEBP);
#endif
			}
		}

		pos++;

		NULLC::cgFuncs[cmd.code](*codeGenCtx, cmd);

		codeGenCtx->ctx.KillLateUnreadRegVmRegisters(exRegVmRegKillInfo.data + codeGenCtx->currInstructionRegKillOffset);
		codeGenCtx->ctx.UnlockRegisters();

		SetOptimizationLookBehind(codeGenCtx->ctx, true);
	}

	globalCodeRanges.push_back(pos);

	// Add extra global return if there is none
	codeGenCtx->ctx.GetLastInstruction()->instID = pos + 1;

	if((codeJumpTargets[exRegVmCode.size()] & 6) != 0)
	{
		EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 0);

#if defined(_M_X64)
		EMIT_OP_REG(codeGenCtx->ctx, o_push, rRBX);
		EMIT_OP_REG(codeGenCtx->ctx, o_push, rR15);
		EMIT_OP_REG_NUM(codeGenCtx->ctx, o_sub64, rRSP, 40);
#else
		EMIT_OP_REG(codeGenCtx->ctx, o_push, rEBP);
		EMIT_OP_REG_REG(codeGenCtx->ctx, o_mov, rEBP, rESP);
		EMIT_OP_REG(codeGenCtx->ctx, o_push, rEBX);
		EMIT_OP_REG(codeGenCtx->ctx, o_push, rESI);
#endif

		EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 1);
	}

	EMIT_OP_REG_REG(codeGenCtx->ctx, o_xor, rEAX, rEAX);

#if defined(_M_X64)
	EMIT_OP_REG_NUM(codeGenCtx->ctx, o_add64, rRSP, 40);
	EMIT_OP_REG(codeGenCtx->ctx, o_pop, rR15);
	EMIT_OP_REG(codeGenCtx->ctx, o_pop, rRBX);
#else
	EMIT_OP_REG(codeGenCtx->ctx, o_pop, rESI);
	EMIT_OP_REG(codeGenCtx->ctx, o_pop, rEBX);
	EMIT_OP_REG_REG(codeGenCtx->ctx, o_mov, rESP, rEBP);
	EMIT_REG_READ(codeGenCtx->ctx, rESP);
	EMIT_OP_REG(codeGenCtx->ctx, o_pop, rEBP);
#endif

	EMIT_OP(codeGenCtx->ctx, o_ret);

	// Remove rviNop, because we don't want to generate code for it
	codeJumpTargets.pop_back();

	instList.resize((int)(codeGenCtx->ctx.GetLastInstruction() - &instList[0]));

	// Once again, mirror extra global return so that jump to global return can be marked (cmdNop, because we will have some custom code)
	codeJumpTargets.push_back(false);

	if(enableLogFiles)
	{
		assert(!output.stream);
		output.stream = output.openStream("asmX86.txt");

		if(output.stream)
		{
			SaveListing(output);

			output.closeStream(output.stream);
			output.stream = NULL;
		}
	}

#if defined(NULLC_OPTIMIZE_X86) && 0
	// Second optimization pass, just feed generated instructions again

	// Set iterator at beginning
	codeGenCtx->ctx.SetLastInstruction(instList.data, instList.data);
	SetOptimizationLookBehind(codeGenCtx->ctx, false);
	// Now regenerate instructions
	for(unsigned int i = 0; i < instList.size(); i++)
	{
		x86Instruction &inst = instList[i];

		// Skip trash
		if(inst.name == o_none)
		{
			EMIT_OP(codeGenCtx->ctx, o_none);
			continue;
		}
		// If invalidation flag is set
		if(inst.instID && codeJumpTargets[inst.instID - 1])
			SetOptimizationLookBehind(codeGenCtx->ctx, false);

		if(inst.name == o_label)
		{
			EMIT_LABEL(codeGenCtx->ctx, inst.labelID, inst.argA.num);
			SetOptimizationLookBehind(codeGenCtx->ctx, true);
			continue;
		}

		switch(inst.argA.type)
		{
		case x86Argument::argNone:
			EMIT_OP(codeGenCtx->ctx, inst.name);
			break;
		case x86Argument::argNumber:
			EMIT_OP_NUM(codeGenCtx->ctx, inst.name, inst.argA.num);
			break;
		case x86Argument::argLabel:
			EMIT_OP_LABEL(codeGenCtx->ctx, inst.name, inst.argA.labelID, inst.argB.num, inst.argB.ptrNum);
			break;
		case x86Argument::argReg:
			switch(inst.argB.type)
			{
			case x86Argument::argNone:
				EMIT_OP_REG(codeGenCtx->ctx, inst.name, inst.argA.reg);
				break;
			case x86Argument::argNumber:
				EMIT_OP_REG_NUM(codeGenCtx->ctx, inst.name, inst.argA.reg, inst.argB.num);
				break;
			case x86Argument::argReg:
				EMIT_OP_REG_REG(codeGenCtx->ctx, inst.name, inst.argA.reg, inst.argB.reg);
				break;
			case x86Argument::argPtr:
				EMIT_OP_REG_RPTR(codeGenCtx->ctx, inst.name, inst.argA.reg, inst.argB.ptrSize, inst.argB.ptrIndex, inst.argB.ptrMult, inst.argB.ptrBase, inst.argB.ptrNum);
				break;
			case x86Argument::argImm64:
				EMIT_OP_REG_NUM64(codeGenCtx->ctx, inst.name, inst.argA.reg, inst.argB.imm64Arg);
				break;
			case x86Argument::argXmmReg:
				EMIT_OP_REG_REG(codeGenCtx->ctx, inst.name, inst.argA.reg, inst.argB.xmmArg);
				break;
			default:
				assert(!"unknown type");
				break;
			}
			break;
		case x86Argument::argPtr:
			switch(inst.argB.type)
			{
			case x86Argument::argNone:
				EMIT_OP_RPTR(codeGenCtx->ctx, inst.name, inst.argA.ptrSize, inst.argA.ptrIndex, inst.argA.ptrMult, inst.argA.ptrBase, inst.argA.ptrNum);
				break;
			case x86Argument::argNumber:
				EMIT_OP_RPTR_NUM(codeGenCtx->ctx, inst.name, inst.argA.ptrSize, inst.argA.ptrIndex, inst.argA.ptrMult, inst.argA.ptrBase, inst.argA.ptrNum, inst.argB.num);
				break;
			case x86Argument::argReg:
				EMIT_OP_RPTR_REG(codeGenCtx->ctx, inst.name, inst.argA.ptrSize, inst.argA.ptrIndex, inst.argA.ptrMult, inst.argA.ptrBase, inst.argA.ptrNum, inst.argB.reg);
				break;
			case x86Argument::argXmmReg:
				EMIT_OP_RPTR_REG(codeGenCtx->ctx, inst.name, inst.argA.ptrSize, inst.argA.ptrIndex, inst.argA.ptrMult, inst.argA.ptrBase, inst.argA.ptrNum, inst.argB.xmmArg);
				break;
			default:
				assert(!"unknown type");
				break;
			}
			break;
		case x86Argument::argXmmReg:
			switch(inst.argB.type)
			{
			case x86Argument::argXmmReg:
				EMIT_OP_REG_REG(codeGenCtx->ctx, inst.name, inst.argA.xmmArg, inst.argB.xmmArg);
				break;
			case x86Argument::argPtr:
				EMIT_OP_REG_RPTR(codeGenCtx->ctx, inst.name, inst.argA.xmmArg, inst.argB.ptrSize, inst.argB.ptrIndex, inst.argB.ptrMult, inst.argB.ptrBase, inst.argB.ptrNum);
				break;
			default:
				assert(!"unknown type");
				break;
			}
			break;
		default:
			assert(!"unknown type");
			break;
		}

		SetOptimizationLookBehind(codeGenCtx->ctx, true);
	}

	unsigned int currSize = (int)(codeGenCtx->ctx.GetLastInstruction() - &instList[0]);
	for(unsigned int i = currSize; i < instList.size(); i++)
	{
		instList[i].name = o_other;
		instList[i].instID = 0;
	}

	if(enableLogFiles)
	{
		assert(!output.stream);
		output.stream = output.openStream("asmX86_opt.txt");

		if(output.stream)
		{
			SaveListing(output);

			output.closeStream(output.stream);
			output.stream = NULL;
		}
	}
#endif

	codeJumpTargets.pop_back();

	bool codeRelocated = false;

	if((binCodeSize + instList.size() * 8) > binCodeReserved)
	{
		unsigned int oldBinCodeReserved = binCodeReserved;
		binCodeReserved = binCodeSize + (instList.size()) * 8 + 4096;	// Average instruction size is 8 bytes.
		unsigned char *binCodeNew = (unsigned char*)NULLC::alloc(binCodeReserved);

		// Disable execution of old code body and enable execution of new code body
#ifndef __linux
		DWORD unusedProtect;
		if(binCode && !codeRunning)
			VirtualProtect((void*)binCode, oldBinCodeReserved, oldCodeBodyProtect, (DWORD*)&unusedProtect);
		VirtualProtect((void*)binCodeNew, binCodeReserved, PAGE_EXECUTE_READWRITE, (DWORD*)&oldCodeBodyProtect);
#else
		if(binCode && !codeRunning)
			NULLC::MemProtect((void*)binCode, oldBinCodeReserved, PROT_READ | PROT_WRITE);
		NULLC::MemProtect((void*)binCodeNew, binCodeReserved, PROT_READ | PROT_WRITE | PROT_EXEC);
#endif

		if(binCodeSize)
			NULLC::copyMemory(binCodeNew, binCode, binCodeSize);

		// If code is currently running, update all instruction pointers
		if(codeRunning)
		{
			codeRelocated = true;

			ExpiredCodeBlock block;

			block.code = binCode;
			block.codeSize = oldBinCodeReserved;

#ifdef _M_X64
			block.unwindTable = functionWin64UnwindTable.data;

			functionWin64UnwindTable.data = NULL;
			functionWin64UnwindTable.count = 0;
			functionWin64UnwindTable.max = 0;
#endif

			expiredCodeBlocks.push_back(block);
		}
		else
		{
			NULLC::dealloc(binCode);
		}

		for(unsigned i = 0; i < instAddress.size(); i++)
			instAddress[i] = (instAddress[i] - binCode) + binCodeNew;

		for(unsigned i = 0; i < functionAddress.size(); i++)
		{
			if(functionAddress[i])
				functionAddress[i] = uintptr_t(functionAddress[i] - binCode) + binCodeNew;
		}

		for(unsigned i = 0; i < expiredFunctionAddressLists.size(); i++)
		{
			ExpiredFunctionAddressList &info = expiredFunctionAddressLists[i];

			for(unsigned k = 0; k < info.count; k++)
			{
				if(info.data[k])
					info.data[k] = uintptr_t(info.data[k] - binCode) + binCodeNew;
			}
		}

		binCode = binCodeNew;
	}

	// Translate to x86
	unsigned char *code = binCode + binCodeSize;

	// Linking in new code, destroy final global return code sequence
	if(binCodeSize != 0)
	{
#if defined(_M_X64)
		code -= 10; // xor eax, eax; add rsp, 40; pop r15; pop rbx; ret;
#else
		code -= 8; // xor eax, eax; mov esp, ebp; pop esi; pop ebx; pop ebp; ret;
#endif
	}

	instAddress.resize(exRegVmCode.size() + 1); // Extra instruction for global return
	NULLC::fillMemory(instAddress.data + lastInstructionCount, 0, (exRegVmCode.size() - lastInstructionCount + 1) * sizeof(instAddress[0]));

	vmState.instAddress = instAddress.data;

	x86ClearLabels();
	x86ReserveLabels(codeGenCtx->labelCount);

	code = x86TranslateInstructionList(code, binCode + binCodeReserved, instList.data, instList.size(), instAddress.data);

	assert(binCodeSize < binCodeReserved);

	binCodeSize = unsigned(code - binCode);

#ifndef __linux

#if defined(_M_X64)
	// Create function table for unwind information
	if(!functionWin64UnwindTable.empty())
		RtlDeleteFunctionTable(functionWin64UnwindTable.data);

	functionWin64UnwindTable.clear();

	// Align data block
	code += 16 - unsigned(uintptr_t(code) % 16);

	// Write the unwind data
	assert(sizeof(UNWIND_CODE) == 2);
	assert(sizeof(UNWIND_INFO_FUNCTION) == 4 + 4 * 2);

	UNWIND_INFO_FUNCTION unwindInfo = { 0 };

	unwindInfo.version = 1;
	unwindInfo.flags = 0; // No EH
	unwindInfo.sizeOfProlog = 7;
	unwindInfo.countOfCodes = 3;
	unwindInfo.frameRegister = 0;
	unwindInfo.frameOffset = 0;

	unwindInfo.unwindCode[0].offsetInPrologue = 7;
	unwindInfo.unwindCode[0].operationCode = UWOP_ALLOC_SMALL;
	unwindInfo.unwindCode[0].operationInfo = (40 - 8) / 8;

	unwindInfo.unwindCode[1].offsetInPrologue = 3;
	unwindInfo.unwindCode[1].operationCode = UWOP_PUSH_NONVOL;
	unwindInfo.unwindCode[1].operationInfo = 15; // r15

	unwindInfo.unwindCode[2].offsetInPrologue = 1;
	unwindInfo.unwindCode[2].operationCode = UWOP_PUSH_NONVOL;
	unwindInfo.unwindCode[2].operationInfo = UWOP_REGISTER_RBX;

	unsigned char *unwindPos = code;

	NULLC::copyMemory(code, &unwindInfo, sizeof(unwindInfo));
	code += sizeof(unwindInfo);

	assert(code < binCode + binCodeReserved);

	for(unsigned i = 0, e = exLinker->exFunctions.size(); i != e; i++)
	{
		ExternFuncInfo &funcInfo = exLinker->exFunctions[i];

		if(funcInfo.regVmAddress != ~0u)
		{
			unsigned char *codeStart = instAddress[funcInfo.regVmAddress];
			unsigned char *codeEnd = instAddress[funcInfo.regVmAddress + funcInfo.regVmCodeSize];

			// Store function info
			RUNTIME_FUNCTION rtFunc;

			rtFunc.BeginAddress = unsigned(codeStart - binCode);
			rtFunc.EndAddress = unsigned(codeEnd - binCode);
			rtFunc.UnwindData = unsigned(unwindPos - binCode);

			functionWin64UnwindTable.push_back(rtFunc);
		}
	}

	for(unsigned i = 0, e = globalCodeRanges.size(); i != e; i += 2)
	{
		unsigned char *codeStart = instAddress[globalCodeRanges[i]];
		unsigned char *codeEnd = instAddress[globalCodeRanges[i + 1]] + unwindInfo.sizeOfProlog; // Add prologue

		// Store function info
		RUNTIME_FUNCTION rtFunc;

		rtFunc.BeginAddress = unsigned(codeStart - binCode);
		rtFunc.EndAddress = unsigned(codeEnd - binCode);
		rtFunc.UnwindData = unsigned(unwindPos - binCode);

		functionWin64UnwindTable.push_back(rtFunc);
	}

	if(!RtlAddFunctionTable(functionWin64UnwindTable.data, functionWin64UnwindTable.size(), uintptr_t(binCode)))
		assert(!"failed to install function table");
#endif

#endif

	assert(unsigned(code - binCode) < binCodeReserved);

	x86SatisfyJumps(instAddress);

	for(unsigned int i = (codeRelocated ? 0 : oldFunctionSize); i < exFunctions.size(); i++)
	{
		if(exFunctions[i].regVmAddress != -1)
			functionAddress[i] = instAddress[exFunctions[i].regVmAddress];
		else
			functionAddress[i] = 0;
	}

	lastInstructionCount = exRegVmCode.size();

	oldJumpTargetCount = exLinker->regVmJumpTargets.size();
	oldRegKillInfoCount = exRegVmRegKillInfo.size();
	oldFunctionSize = exFunctions.size();

	return true;
}